

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QDate __thiscall
QLocale::toDate(QLocale *this,QString *string,QString *format,QCalendar cal,int baseYear)

{
  bool bVar1;
  long in_FS_OFFSET;
  QStringView newFormat;
  QDateTimeParser dt;
  QDateTimeParser QStack_d8;
  QDate local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.jd = -0x8000000000000000;
  memset(&QStack_d8,0xaa,0x98);
  QDateTimeParser::QDateTimeParser(&QStack_d8,QDate,FromString,cal);
  QSharedDataPointer<QLocalePrivate>::reset(&QStack_d8.defaultLocale.d,(this->d).d.ptr);
  newFormat.m_data = (format->d).ptr;
  newFormat.m_size = (format->d).size;
  bVar1 = QDateTimeParser::parseFormat(&QStack_d8,newFormat);
  if (bVar1) {
    QDateTimeParser::fromString(&QStack_d8,string,&local_40,(QTime *)0x0,baseYear);
  }
  QDateTimeParser::~QDateTimeParser(&QStack_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDate)local_40.jd;
  }
  __stack_chk_fail();
}

Assistant:

QDate QLocale::toDate(const QString &string, const QString &format, QCalendar cal, int baseYear) const
{
    QDate date;
#if QT_CONFIG(datetimeparser)
    QDateTimeParser dt(QMetaType::QDate, QDateTimeParser::FromString, cal);
    dt.setDefaultLocale(*this);
    if (dt.parseFormat(format))
        dt.fromString(string, &date, nullptr, baseYear);
#else
    Q_UNUSED(string);
    Q_UNUSED(format);
    Q_UNUSED(baseYear);
    Q_UNUSED(cal);
#endif
    return date;
}